

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::ApplyS<float,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  float *val;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  VecAccum<float,_4> local_51;
  int local_50;
  int local_4c;
  int local_48;
  float local_44;
  float local_40;
  float local_3c;
  void *local_38;
  
  fVar7 = k->A + k->A;
  local_48 = k->v1;
  local_4c = -local_48;
  local_50 = nTxChan;
  local_44 = fVar7;
  local_38 = data;
  for (; local_48 != k->v2; local_48 = local_48 + 1) {
    iVar2 = k->rowlen;
    iVar3 = k->u1;
    iVar5 = (iVar2 - local_48) - k->w2;
    if (iVar5 < iVar3) {
      iVar5 = iVar3;
    }
    iVar4 = (iVar2 - local_48) - k->w1;
    if (k->u2 < iVar4) {
      iVar4 = k->u2;
    }
    fVar8 = (float)iVar5 - k->u;
    fVar6 = (float)local_48 - k->v;
    local_40 = (fVar8 + fVar8 + 1.0) * k->A + fVar6 * k->B;
    local_3c = k->A * fVar8 * fVar8 + (k->B * fVar8 + k->C * fVar6) * fVar6;
    pfVar1 = (float *)((long)local_38 +
                      (long)((iVar4 - iVar5) * local_50) * 4 +
                      (long)((iVar5 + iVar2 * local_48) * local_50) * 4);
    iVar5 = (iVar2 + local_4c) - k->w2;
    if (iVar5 < iVar3) {
      iVar5 = iVar3;
    }
    for (val = (float *)((long)local_38 + (long)((iVar5 + iVar2 * local_48) * local_50) * 4);
        val < pfVar1; val = val + nTxChan) {
      if (local_3c < 1.0) {
        fVar7 = anon_unknown_2::gaussian(local_3c);
        fVar7 = fVar7 * k->wscale;
        k->weight = k->weight + fVar7;
        PtexUtils::VecAccum<float,_4>::operator()(&local_51,result,val,fVar7);
        fVar7 = local_44;
      }
      local_3c = local_3c + local_40;
      local_40 = local_40 + fVar7;
    }
    local_4c = local_4c + -1;
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }